

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack3_16(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar9 [64];
  
  auVar6 = vpmovsxbd_avx512f(_DAT_00185430);
  auVar7 = vpmovsxbd_avx512f(_DAT_00185440);
  auVar5 = vpbroadcastd_avx512vl();
  auVar2 = vpsrlvd_avx2(auVar5,_DAT_0018dd80);
  auVar1 = vpinsrd_avx(auVar5._0_16_,in[1] * 4,1);
  auVar4 = vpinsrd_avx(auVar1,in[1],2);
  auVar3._8_4_ = 4;
  auVar3._0_8_ = 0x400000004;
  auVar3._12_4_ = 4;
  auVar3 = vpandd_avx512vl(auVar1,auVar3);
  auVar1 = vpshufd_avx(auVar4,0xa4);
  auVar1 = vpsrlvd_avx2(auVar1,_DAT_00190f20);
  auVar6 = vpermi2d_avx512f(auVar6,ZEXT3264(auVar2),ZEXT3264(auVar5));
  auVar1 = vpblendd_avx2(auVar1,auVar3,2);
  auVar4 = vpbroadcastd_avx512vl();
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_00190f30);
  auVar6 = vpermi2d_avx512f(auVar7,auVar6,ZEXT1664(auVar1));
  auVar7 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar8 = vmovdqa64_avx512f(auVar6);
  auVar9 = vpbroadcastd_avx512f();
  auVar10._0_52_ = auVar8._0_52_;
  auVar10._52_4_ = auVar9._52_4_;
  auVar10._56_4_ = auVar8._56_4_;
  auVar10._60_4_ = auVar8._60_4_;
  auVar7 = vpermi2q_avx512f(auVar7,auVar10,ZEXT1664(auVar4));
  auVar8 = vpbroadcastd_avx512f(ZEXT416(7));
  auVar7 = vpandd_avx512f(auVar7,auVar8);
  auVar9 = vpbroadcastd_avx512f();
  auVar11._0_40_ = auVar8._0_40_;
  auVar11._40_4_ = auVar9._40_4_;
  auVar11._44_4_ = auVar8._44_4_;
  auVar11._48_4_ = auVar8._48_4_;
  auVar11._52_4_ = auVar8._52_4_;
  auVar11._56_4_ = auVar8._56_4_;
  auVar11._60_4_ = auVar8._60_4_;
  auVar6 = vpord_avx512f(auVar6,auVar11);
  auVar8._0_40_ = auVar7._0_40_;
  auVar8._40_4_ = auVar6._40_4_;
  auVar8._44_4_ = auVar7._44_4_;
  auVar8._48_4_ = auVar7._48_4_;
  auVar8._52_4_ = auVar7._52_4_;
  auVar8._56_4_ = auVar7._56_4_;
  auVar8._60_4_ = auVar7._60_4_;
  auVar6 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])out = auVar6;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack3_16(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 3);
  out++;
  *out = ((*in) >> 3) % (1U << 3);
  out++;
  *out = ((*in) >> 6) % (1U << 3);
  out++;
  *out = ((*in) >> 9) % (1U << 3);
  out++;
  *out = ((*in) >> 12) % (1U << 3);
  out++;
  *out = ((*in) >> 15) % (1U << 3);
  out++;
  *out = ((*in) >> 18) % (1U << 3);
  out++;
  *out = ((*in) >> 21) % (1U << 3);
  out++;
  *out = ((*in) >> 24) % (1U << 3);
  out++;
  *out = ((*in) >> 27) % (1U << 3);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 1)) << (3 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 3);
  out++;
  *out = ((*in) >> 4) % (1U << 3);
  out++;
  *out = ((*in) >> 7) % (1U << 3);
  out++;
  *out = ((*in) >> 10) % (1U << 3);
  out++;
  *out = ((*in) >> 13) % (1U << 3);
  out++;

  return in + 1;
}